

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECommander.h
# Opt level: O2

void __thiscall
PrintStringsCommand::execute(PrintStringsCommand *this,CmdParams *params,CmdContext *context)

{
  PEFile *this_00;
  ResourcesContainer *this_01;
  size_t sVar1;
  ostream *poVar2;
  allocator<char> local_31;
  string local_30;
  
  this_00 = cmd_util::getPEFromContext(context);
  if (this_00 != (PEFile *)0x0) {
    this_01 = PEFile::getResourcesOfType(this_00,RESTYPE_STRING);
    if (this_01 == (ResourcesContainer *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No such resource type!");
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
    sVar1 = ResourcesContainer::entriesCount(this_01);
    poVar2 = std::operator<<((ostream *)&std::cout,"Total: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    if (sVar1 < 0x65) {
      sVar1 = 0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"max",&local_31);
      sVar1 = cmd_util::readNumber(&local_30,false);
      std::__cxx11::string::~string((string *)&local_30);
    }
    cmd_util::printStrings(this_00,sVar1);
  }
  return;
}

Assistant:

virtual void execute(CmdParams *params, CmdContext  *context)
    {
        PEFile *pe = cmd_util::getPEFromContext(context);
        if (!pe) return;

        ResourcesContainer* container = pe->getResourcesOfType(pe::RESTYPE_STRING);
        if (container == NULL) {
            std::cout << "No such resource type!" << std::endl;
            return;
        }
        size_t max = container->entriesCount();
        std::cout << "Total: " << max << std::endl;
        size_t limit = 0;
        if (max > 100) {
            limit = cmd_util::readNumber("max");
        }

       cmd_util::printStrings(pe, limit);
    }